

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.h
# Opt level: O0

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor,FileDescriptor *file,
                   bool preSpace,bool postNewline)

{
  MessageOptions *this;
  FileOptions *this_00;
  allocator<char> local_35 [16];
  allocator<char> local_25;
  undefined1 local_24;
  bool local_23;
  byte local_22;
  byte local_21;
  bool isDeprecated;
  bool postNewline_local;
  FileDescriptor *pFStack_20;
  bool preSpace_local;
  FileDescriptor *file_local;
  Descriptor *descriptor_local;
  string *result;
  
  local_22 = postNewline;
  local_21 = preSpace;
  pFStack_20 = file;
  file_local = (FileDescriptor *)descriptor;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  this = Descriptor::options(descriptor);
  local_23 = MessageOptions::deprecated(this);
  if ((!local_23) && (pFStack_20 != (FileDescriptor *)0x0)) {
    this_00 = FileDescriptor::options(pFStack_20);
    local_23 = FileOptions::deprecated(this_00);
  }
  if (local_23 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_35)
    ;
    std::allocator<char>::~allocator(local_35);
  }
  else {
    local_24 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DEPRECATED_ATTRIBUTE",&local_25);
    std::allocator<char>::~allocator(&local_25);
    if ((local_21 & 1) != 0) {
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)0x0);
    }
    if ((local_22 & 1) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string GetOptionalDeprecatedAttribute(
    const TDescriptor* descriptor,
    const FileDescriptor* file = NULL,
    bool preSpace = true, bool postNewline = false) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  if (!isDeprecated && file) {
    isDeprecated = file->options().deprecated();
  }
  if (isDeprecated) {
    string result = "DEPRECATED_ATTRIBUTE";
    if (preSpace) {
      result.insert(0, " ");
    }
    if (postNewline) {
      result.append("\n");
    }
    return result;
  } else {
    return "";
  }
}